

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O0

void iutest::detail::iuUniversalPrinter<std::any>::Print(any *value,iu_ostream *os)

{
  iu_ostream *os_local;
  any *value_local;
  
  UniversalPrintTo<std::any>(value,os);
  return;
}

Assistant:

static void Print(const T& value, iu_ostream* os)
    {
        UniversalPrintTo(value, os);
    }